

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulate.h
# Opt level: O0

uint32_t __thiscall snestistics::EmulateRegisters::remap(EmulateRegisters *this,uint32_t address)

{
  ushort uVar1;
  byte local_15;
  uint16_t a;
  uint8_t bank;
  uint32_t address_local;
  EmulateRegisters *this_local;
  
  local_15 = (byte)(address >> 0x10);
  uVar1 = (ushort)address;
  if ((uVar1 < 0x8000) && ((local_15 < 0x40 || ((0x7f < local_15 && (local_15 < 0xc0)))))) {
    if (uVar1 < 0x2000) {
      local_15 = 0x7e;
    }
    else {
      local_15 = 0;
    }
  }
  return (uint)CONCAT12(local_15,uVar1);
}

Assistant:

uint32_t remap(uint32_t address) const {
		uint8_t bank = address >> 16;
		const uint16_t a = address & 0xFFFF;
		if (a < 0x8000) {
			if ((bank >= 0x00 && bank <= 0x3f) || (bank >= 0x80 && bank <= 0xBF)) {
				if (a < 0x2000) {
					bank = 0x7E;
				} else  {
					bank = 0;
				}
			}
		}
		return (bank<<16)|a;
	}